

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

StmtNode * __thiscall Parser::ElseStmt(Parser *this)

{
  StmtNode *pSVar1;
  
  if (this->tok == 9) {
    Eat(this,9);
    pSVar1 = Stmt(this);
    return pSVar1;
  }
  return (StmtNode *)0x0;
}

Assistant:

StmtNode *Parser::ElseStmt() {
    switch (tok) {
        case ELSE: {
            Eat(ELSE);
            return Stmt();
        }
        default: {
            return nullptr;
        }
    }
}